

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O3

object * object_split(object *src,wchar_t amt)

{
  object *dest;
  object *poVar1;
  object *poVar2;
  
  dest = (object *)mem_alloc(0x148);
  memcpy(dest,&OBJECT_NULL,0x148);
  object_copy(dest,src);
  if (src->known != (object *)0x0) {
    src->known->number = src->number;
    poVar1 = (object *)mem_alloc(0x148);
    memcpy(poVar1,&OBJECT_NULL,0x148);
    object_copy(poVar1,src->known);
    dest->known = poVar1;
  }
  if ((int)(uint)src->number <= amt) {
    __assert_fail("src->number > amt",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                  ,0x31e,"struct object *object_split(struct object *, int)");
  }
  distribute_charges(src,dest,amt);
  if (src->known != (object *)0x0) {
    distribute_charges(src->known,dest->known,amt);
  }
  dest->number = (uint8_t)amt;
  src->number = src->number - (uint8_t)amt;
  if (src->note != 0) {
    dest->note = src->note;
  }
  poVar1 = src->known;
  if (poVar1 == (object *)0x0) {
    poVar2 = dest->known;
    if (poVar2 == (object *)0x0) goto LAB_001aaa19;
  }
  else {
    poVar2 = dest->known;
    poVar2->number = dest->number;
    poVar1->number = src->number;
    poVar2->note = poVar1->note;
  }
  poVar2->oidx = 0;
LAB_001aaa19:
  dest->oidx = 0;
  return dest;
}

Assistant:

struct object *object_split(struct object *src, int amt)
{
	struct object *dest = object_new(), *dest_known;

	/* Get a copy of the object */
	object_copy(dest, src);

	/* Do we need a new known object? */
	if (src->known) {
		/* Ensure numbers are aligned (should not be necessary, but safer) */
		src->known->number = src->number;

		/* Make the new object */
		dest_known = object_new();
		object_copy(dest_known, src->known);
		dest->known = dest_known;
	}

	/* Check legality */
	assert(src->number > amt);

	/* Distribute charges of wands, staves, or rods */
	distribute_charges(src, dest, amt);
	if (src->known)
		distribute_charges(src->known, dest->known, amt);

	/* Modify quantity */
	dest->number = amt;
	src->number -= amt;
	if (src->note)
		dest->note = src->note;
	if (src->known) {
		dest->known->number = dest->number;
		src->known->number = src->number;
		dest->known->note = src->known->note;
	}

	/* Remove any index */
	if (dest->known)
		dest->known->oidx = 0;
	dest->oidx = 0;

	return dest;
}